

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionSpecConstantWorkDim
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint id;
  DiagnosticStream *this;
  DiagnosticStream local_1f8;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  id = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant(_,id);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
    this = DiagnosticStream::operator<<
                     (&local_1f8,(char (*) [49])"Dim must be a 32-bit unsigned integer OpConstant");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionSpecConstantWorkDim(
    ValidationState_t& _, const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Dim must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}